

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O1

Qiniu_Error Qiniu_Qetag_DigestFile(char *localFile,char **digest)

{
  _Qiniu_Qetag_Context *ctx_00;
  uint uVar1;
  char *buf;
  size_t bufSize;
  long offset;
  char *pcVar2;
  Qiniu_Error QVar3;
  _Qiniu_Qetag_Context *ctx;
  Qiniu_File *f;
  _Qiniu_Qetag_Context *local_48;
  Qiniu_File *local_40;
  char **local_38;
  
  local_40 = (Qiniu_File *)0x0;
  local_48 = (_Qiniu_Qetag_Context *)0x0;
  buf = (char *)malloc(0x100000);
  if (buf == (char *)0x0) {
    pcVar2 = "no enough memory";
    uVar1 = 9999;
  }
  else {
    QVar3 = Qiniu_Qetag_New(&local_48,1);
    pcVar2 = QVar3.message;
    uVar1 = QVar3.code;
    if (uVar1 == 200) {
      QVar3 = Qiniu_File_Open(&local_40,localFile);
      ctx_00 = local_48;
      pcVar2 = QVar3.message;
      uVar1 = QVar3.code;
      if (uVar1 == 200) {
        offset = 0;
        pcVar2 = "failed in reading file";
        local_38 = digest;
        do {
          bufSize = Qiniu_File_ReadAt(local_40,buf,0x100000,offset);
          if ((long)bufSize < 0) {
            uVar1 = 0x2706;
            goto LAB_001144ea;
          }
          if (bufSize != 0) {
            QVar3 = Qiniu_Qetag_Update(ctx_00,buf,bufSize);
            if (QVar3.code != 200) goto LAB_001144c2;
            offset = offset + bufSize;
          }
        } while (bufSize != 0);
        QVar3 = Qiniu_Qetag_Final(local_48,local_38);
LAB_001144c2:
        pcVar2 = QVar3.message;
        uVar1 = QVar3.code;
LAB_001144ea:
        Qiniu_File_Close(local_40);
      }
      if (local_48 != (_Qiniu_Qetag_Context *)0x0) {
        free(local_48);
      }
    }
    free(buf);
  }
  QVar3._4_4_ = 0;
  QVar3.code = uVar1;
  QVar3.message = pcVar2;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_Qetag_DigestFile(const char * localFile, char ** digest)
{
    Qiniu_Error err;
    Qiniu_Off_T offset = 0;
    size_t readingBytes = (BLOCK_MAX_SIZE >> 2);
    ssize_t readBytes = 0;
	Qiniu_File * f = NULL;
    struct _Qiniu_Qetag_Context * ctx = NULL;
    char * buf = NULL;

    // 1MB buffer
    buf = malloc(readingBytes);
    if (!buf) {
        err.code = 9999;
        err.message = "no enough memory";
        return err;
    }

    err = Qiniu_Qetag_New(&ctx, 1);
    if (err.code != 200) {
        goto DIGESTFILE_NEWCTX_ERROR;
    }

	err = Qiniu_File_Open(&f, localFile);
	if (err.code != 200) {
        goto DIGESTFILE_OPEN_ERROR;
	}

    do {
        readBytes = Qiniu_File_ReadAt(f, buf, readingBytes, offset);
        if (readBytes < 0) {
            err.code = 9990;
            err.message = "failed in reading file";
            goto DIGESTFILE_UPDATE_ERROR;
        } else if (readBytes > 0) {
            err = Qiniu_Qetag_Update(ctx, buf, readBytes);
            if (err.code != 200) {
                goto DIGESTFILE_UPDATE_ERROR;
            }
            offset += readBytes;
        } // if
    } while(readBytes > 0);

    err = Qiniu_Qetag_Final(ctx, digest);

DIGESTFILE_UPDATE_ERROR:
    Qiniu_File_Close(f);

DIGESTFILE_OPEN_ERROR:
    Qiniu_Qetag_Destroy(ctx);

DIGESTFILE_NEWCTX_ERROR:
    free(buf);

    return err;
}